

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O1

opj_thread_pool_t * opj_thread_pool_create(int num_threads)

{
  pthread_mutex_t *__mutex;
  byte bVar1;
  opj_thread_pool_t *tp;
  opj_mutex_t *poVar2;
  opj_cond_t *poVar3;
  opj_worker_thread_t *poVar4;
  opj_thread_t *poVar5;
  opj_tls_t *poVar6;
  int iVar7;
  pthread_cond_t *__cond;
  long lVar8;
  
  tp = (opj_thread_pool_t *)opj_calloc(1,0x58);
  if (tp != (opj_thread_pool_t *)0x0) {
    tp->state = OPJWTS_OK;
    if (num_threads < 1) {
      poVar6 = (opj_tls_t *)opj_calloc(1,0x10);
      tp->tls = poVar6;
      if (poVar6 != (opj_tls_t *)0x0) {
        return tp;
      }
    }
    else {
      poVar2 = opj_mutex_create();
      tp->mutex = poVar2;
      if (poVar2 != (opj_mutex_t *)0x0) {
        poVar3 = opj_cond_create();
        tp->cond = poVar3;
        if (poVar3 != (opj_cond_t *)0x0) {
          poVar4 = (opj_worker_thread_t *)opj_calloc((ulong)(uint)num_threads,0x28);
          tp->worker_threads = poVar4;
          if (poVar4 != (opj_worker_thread_t *)0x0) {
            tp->worker_threads_count = num_threads;
            lVar8 = 0;
            iVar7 = 0;
            do {
              *(opj_thread_pool_t **)((long)&tp->worker_threads->tp + lVar8) = tp;
              poVar2 = opj_mutex_create();
              *(opj_mutex_t **)((long)&tp->worker_threads->mutex + lVar8) = poVar2;
              if (poVar2 == (opj_mutex_t *)0x0) {
LAB_00108211:
                tp->worker_threads_count = iVar7;
                bVar1 = 1;
                goto LAB_00108217;
              }
              poVar3 = opj_cond_create();
              poVar4 = tp->worker_threads;
              *(opj_cond_t **)((long)&poVar4->cond + lVar8) = poVar3;
              if (poVar3 == (opj_cond_t *)0x0) {
                __cond = *(pthread_cond_t **)((long)&poVar4->mutex + lVar8);
                if (__cond != (pthread_cond_t *)0x0) {
                  pthread_mutex_destroy((pthread_mutex_t *)__cond);
LAB_00108209:
                  opj_free(__cond);
                }
                goto LAB_00108211;
              }
              *(undefined4 *)((long)&poVar4->marked_as_waiting + lVar8) = 0;
              poVar5 = opj_thread_create(opj_worker_thread_function,
                                         (void *)((long)&poVar4->tp + lVar8));
              poVar4 = tp->worker_threads;
              *(opj_thread_t **)((long)&poVar4->thread + lVar8) = poVar5;
              if (poVar5 == (opj_thread_t *)0x0) {
                __mutex = *(pthread_mutex_t **)((long)&poVar4->mutex + lVar8);
                if (__mutex != (pthread_mutex_t *)0x0) {
                  pthread_mutex_destroy(__mutex);
                  opj_free(__mutex);
                }
                __cond = *(pthread_cond_t **)((long)&tp->worker_threads->cond + lVar8);
                if (__cond != (pthread_cond_t *)0x0) {
                  pthread_cond_destroy(__cond);
                  goto LAB_00108209;
                }
                goto LAB_00108211;
              }
              iVar7 = iVar7 + 1;
              lVar8 = lVar8 + 0x28;
            } while ((ulong)(uint)num_threads * 0x28 != lVar8);
            bVar1 = 0;
LAB_00108217:
            pthread_mutex_lock((pthread_mutex_t *)tp->mutex);
            while (tp->waiting_worker_thread_count < tp->worker_threads_count) {
              pthread_cond_wait((pthread_cond_t *)tp->cond,(pthread_mutex_t *)tp->mutex);
            }
            pthread_mutex_unlock((pthread_mutex_t *)tp->mutex);
            if ((bool)(tp->state != OPJWTS_ERROR & (bVar1 ^ 1))) {
              return tp;
            }
          }
        }
        opj_thread_pool_destroy(tp);
        return (opj_thread_pool_t *)0x0;
      }
    }
    opj_free(tp);
  }
  return (opj_thread_pool_t *)0x0;
}

Assistant:

opj_thread_pool_t* opj_thread_pool_create(int num_threads)
{
    opj_thread_pool_t* tp;

    tp = (opj_thread_pool_t*) opj_calloc(1, sizeof(opj_thread_pool_t));
    if (!tp) {
        return NULL;
    }
    tp->state = OPJWTS_OK;

    if (num_threads <= 0) {
        tp->tls = opj_tls_new();
        if (!tp->tls) {
            opj_free(tp);
            tp = NULL;
        }
        return tp;
    }

    tp->mutex = opj_mutex_create();
    if (!tp->mutex) {
        opj_free(tp);
        return NULL;
    }
    if (!opj_thread_pool_setup(tp, num_threads)) {
        opj_thread_pool_destroy(tp);
        return NULL;
    }
    return tp;
}